

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          unsigned_long batchSize,InnerRegisterSupplier *registerSupplier)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  *pCVar5;
  size_type sVar6;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  *in_RDX;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
  *in_RSI;
  OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  *in_RDI;
  ulong in_R8;
  KeyValue<supermap::Key<1UL>,_unsigned_long> minItem;
  int32_t i_1;
  bool hasMin;
  size_t min;
  anon_class_24_3_5b0b3c05 dropWriteBuffer;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  writeBuffer;
  anon_class_24_3_7a9e0d2b updateOnce;
  size_t i;
  uint64_t totalSize;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  frontLine;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currentFrontPointers;
  size_t storagesCount;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>_()>
  *in_stack_fffffffffffffdb8;
  path *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  anon_class_24_3_5b0b3c05 *in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  format in_stack_fffffffffffffde7;
  string_type *in_stack_fffffffffffffde8;
  path *in_stack_fffffffffffffdf0;
  InnerRegisterSupplier *in_stack_fffffffffffffe28;
  shared_ptr<supermap::io::FileManager> *in_stack_fffffffffffffe30;
  path *in_stack_fffffffffffffe38;
  int local_170;
  size_type local_168;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  local_148;
  undefined1 *local_130;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
  *local_128;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  *local_120;
  undefined1 local_118;
  ulong local_108;
  long local_100;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  local_d8;
  undefined1 local_b8 [24];
  size_type local_a0;
  ulong local_28;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
  *local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  std::filesystem::__cxx11::path::path
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde7);
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffdc0,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffdb8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>_()>
              *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  ::SingleFileIndexedStorage
            (in_RDX,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>_()>
               *)0x122b42);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x122b4f);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffdc0);
  Findable<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>::Findable
            ((Findable<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_> *
             )&in_RDI[1].register_.count_);
  in_RDI->_vptr_OrderedStorage = (_func_int **)&PTR_append_0016d740;
  in_RDI[1].register_.count_ = (unsigned_long)&DAT_0016d788;
  local_a0 = std::
             vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
             ::size(local_10);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x122bc1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
             ,(allocator_type *)in_stack_fffffffffffffdd0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x122bea);
  std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::optional();
  std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>::allocator
            ((allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_> *)
             0x122c1b);
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  ::vector((vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
           in_stack_fffffffffffffdd8,(value_type *)in_stack_fffffffffffffdd0,
           (allocator_type *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>::~allocator
            ((allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_> *)
             0x122c46);
  local_100 = 0;
  for (local_108 = 0; local_108 < local_a0; local_108 = local_108 + 1) {
    pvVar4 = std::
             vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
             ::operator[](local_10,local_108);
    iVar3 = (*(pvVar4->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              ._vptr_OrderedStorage[1])();
    if (CONCAT44(extraout_var,iVar3) != 0) {
      std::
      vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
      ::operator[](&local_d8,local_108);
      pvVar4 = std::
               vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
               ::operator[](local_10,local_108);
      iVar3 = (*(pvVar4->
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                ).
                super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                .
                super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                ._vptr_OrderedStorage[4])(pvVar4,0);
      local_118 = (undefined1)iVar3;
      std::optional<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>::
      emplace<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>
                ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)
                 in_stack_fffffffffffffdc0,
                 (KeyValue<supermap::Key<1UL>,_unsigned_long> *)in_stack_fffffffffffffdb8);
      pvVar4 = std::
               vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
               ::operator[](local_10,local_108);
      iVar3 = (*(pvVar4->
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                ).
                super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                .
                super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                ._vptr_OrderedStorage[1])();
      local_100 = CONCAT44(extraout_var_00,iVar3) + local_100;
    }
  }
  pCVar5 = OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
           ::getRegister(in_RDI);
  (*(pCVar5->
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>
    ).
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
    ._vptr_Cloneable[5])(pCVar5,local_100);
  local_130 = local_b8;
  local_128 = local_10;
  local_120 = &local_d8;
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  ::vector((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
            *)0x122e68);
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
             *)in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
  while( true ) {
    local_168 = 0;
    bVar1 = false;
    local_170 = (int)local_a0;
    while (local_170 = local_170 + -1, -1 < local_170) {
      std::
      vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
      ::operator[](&local_d8,(long)local_170);
      bVar2 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::has_value
                        ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)
                         0x122f00);
      if (bVar2) {
        if (bVar1) {
          std::
          vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
          ::operator[](&local_d8,(long)local_170);
          in_stack_fffffffffffffdf0 =
               (path *)std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::value
                                 ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                                   *)in_stack_fffffffffffffdc0);
          std::
          vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
          ::operator[](&local_d8,local_168);
          in_stack_fffffffffffffde8 =
               (string_type *)
               std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::value
                         ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)
                          in_stack_fffffffffffffdc0);
          bVar2 = KeyValue<supermap::Key<1UL>,_unsigned_long>::operator<
                            ((KeyValue<supermap::Key<1UL>,_unsigned_long> *)
                             in_stack_fffffffffffffdc0,
                             (KeyValue<supermap::Key<1UL>,_unsigned_long> *)
                             in_stack_fffffffffffffdb8);
          if (bVar2) {
            local_168 = (size_type)local_170;
          }
          else {
            std::
            vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
            ::operator[](&local_d8,(long)local_170);
            std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::value
                      ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)
                       in_stack_fffffffffffffdc0);
            std::
            vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
            ::operator[](&local_d8,local_168);
            in_stack_fffffffffffffdd0 =
                 (anon_class_24_3_5b0b3c05 *)
                 std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::value
                           ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)
                            in_stack_fffffffffffffdc0);
            bVar2 = KeyValue<supermap::Key<1UL>,_unsigned_long>::operator==
                              ((KeyValue<supermap::Key<1UL>,_unsigned_long> *)
                               in_stack_fffffffffffffdc0,
                               (KeyValue<supermap::Key<1UL>,_unsigned_long> *)
                               in_stack_fffffffffffffdb8);
            if (bVar2) {
              SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
                        ((anon_class_24_3_7a9e0d2b *)in_stack_fffffffffffffdf0,
                         (int32_t)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            }
          }
        }
        else {
          bVar1 = true;
          local_168 = (size_type)local_170;
        }
      }
    }
    if (!bVar1) break;
    std::
    vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
    ::operator[](&local_d8,local_168);
    in_stack_fffffffffffffdc0 =
         (path *)std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::value
                           ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)
                            in_stack_fffffffffffffdc0);
    SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
              ((anon_class_24_3_7a9e0d2b *)in_stack_fffffffffffffdf0,
               (int32_t)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    std::
    vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
    ::push_back((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
    sVar6 = std::
            vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
            ::size(&local_148);
    if (local_28 <= sVar6) {
      SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()
                (in_stack_fffffffffffffdd0);
    }
  }
  SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(in_stack_fffffffffffffdd0);
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  ::~vector((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
             *)in_stack_fffffffffffffdd0);
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  ::~vector((vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
             *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }